

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::uhugeint_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::BinaryUhugeIntOperator>>
               (uhugeint_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Vector *vector;
  ulong uVar10;
  bool bVar11;
  string_t sVar12;
  uhugeint_t input;
  uhugeint_t input_00;
  uhugeint_t input_01;
  Vector *vector_1;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar5 = 8;
    while (bVar11 = count != 0, count = count - 1, bVar11) {
      input.upper = (uint64_t)dataptr;
      input.lower = *(uint64_t *)((long)&ldata->lower + lVar5);
      sVar12 = BinaryUhugeIntOperator::Operation<duckdb::uhugeint_t,duckdb::string_t>
                         (*(BinaryUhugeIntOperator **)((long)ldata + lVar5 + -8),input,
                          (Vector *)mask);
      *(long *)((long)result_data + lVar5 + -8) = sVar12.value._0_8_;
      *(long *)((long)&result_data->value + lVar5) = sVar12.value._8_8_;
      lVar5 = lVar5 + 0x10;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    uVar8 = 0;
    for (pVVar3 = (Vector *)0x0; pVVar3 != (Vector *)(count + 0x3f >> 6);
        pVVar3 = (Vector *)&pVVar3->field_0x1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
LAB_00d6def6:
        uVar6 = uVar8 << 4 | 8;
        pVVar4 = pVVar3;
        for (; uVar2 = uVar8, uVar8 < uVar9; uVar8 = uVar8 + 1) {
          input_00.upper = (uint64_t)dataptr;
          input_00.lower = *(uint64_t *)((long)&ldata->lower + uVar6);
          sVar12 = BinaryUhugeIntOperator::Operation<duckdb::uhugeint_t,duckdb::string_t>
                             (*(BinaryUhugeIntOperator **)((long)ldata + (uVar6 - 8)),input_00,
                              pVVar4);
          *(long *)((long)result_data + (uVar6 - 8)) = sVar12.value._0_8_;
          *(long *)((long)&result_data->value + uVar6) = sVar12.value._8_8_;
          uVar6 = uVar6 + 0x10;
        }
      }
      else {
        uVar6 = puVar1[(long)pVVar3];
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
        if (uVar6 == 0xffffffffffffffff) goto LAB_00d6def6;
        uVar2 = uVar9;
        if (uVar6 != 0) {
          uVar10 = uVar8 << 4 | 8;
          pVVar4 = pVVar3;
          for (uVar7 = 0; uVar2 = uVar7 + uVar8, uVar7 + uVar8 < uVar9; uVar7 = uVar7 + 1) {
            if ((uVar6 >> (uVar7 & 0x3f) & 1) != 0) {
              input_01.upper = (uint64_t)dataptr;
              input_01.lower = *(uint64_t *)((long)&ldata->lower + uVar10);
              sVar12 = BinaryUhugeIntOperator::Operation<duckdb::uhugeint_t,duckdb::string_t>
                                 (*(BinaryUhugeIntOperator **)((long)ldata + (uVar10 - 8)),input_01,
                                  pVVar4);
              *(long *)((long)result_data + (uVar10 - 8)) = sVar12.value._0_8_;
              *(long *)((long)&result_data->value + uVar10) = sVar12.value._8_8_;
              pVVar4 = (Vector *)result_data;
            }
            uVar10 = uVar10 + 0x10;
          }
        }
      }
      uVar8 = uVar2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}